

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherSetupData *setupData)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CodePointMatcher *pCVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  this->fSetupData = setupData;
  (this->fMinusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->fMinusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fMinusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003b54c0;
  (this->fPlusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->fPlusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPlusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003b5678;
  (this->fPercent).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->fPercent).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPercent).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003b55c8;
  (this->fPermille).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->fPermille).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPermille).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003b5620;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher(&this->fCurrency);
  auVar2 = _DAT_002f6260;
  auVar1 = _DAT_002f6250;
  pCVar3 = (this->fCodePoints).codePoints._M_elems + 1;
  lVar4 = 0;
  do {
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5 = (auVar5 | auVar1) ^ auVar2;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffffb) {
      ((array<icu_63::numparse::impl::CodePointMatcher,_5UL> *)(pCVar3 + -1))->_M_elems[0].
      super_NumberParseMatcher._vptr_NumberParseMatcher =
           (_func_int **)&PTR__NumberParseMatcher_003b62b0;
      (pCVar3->super_NumberParseMatcher)._vptr_NumberParseMatcher =
           (_func_int **)&PTR__NumberParseMatcher_003b62b0;
    }
    lVar4 = lVar4 + 2;
    pCVar3 = pCVar3 + 2;
  } while (lVar4 != 6);
  (this->fCodePoints).codePointsOverflow.ptr = (this->fCodePoints).codePointsOverflow.stackArray;
  (this->fCodePoints).codePointsOverflow.capacity = 3;
  (this->fCodePoints).codePointsOverflow.needToRelease = '\0';
  (this->fCodePoints).codePointCount = 0;
  (this->fCodePoints).codePointNumBatches = 0;
  return;
}

Assistant:

AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData)
        : fSetupData(setupData) {}